

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.h
# Opt level: O0

void __thiscall lumeview::Shader::add_source(Shader *this,string *filename,GLenum shaderType)

{
  PFNGLATTACHSHADERPROC p_Var1;
  GLuint GVar2;
  ShaderData *pSVar3;
  ostream *poVar4;
  LumeviewError *this_00;
  string local_410 [32];
  stringstream local_3f0 [8];
  stringstream ss;
  ostream local_3e0 [376];
  GLchar local_268 [8];
  char infoLog [512];
  int local_60 [2];
  int success;
  GLuint local_4c;
  GLchar *pGStack_48;
  uint shader;
  char *shaderSrcCStr;
  string shaderSrc;
  GLenum local_1c;
  string *psStack_18;
  GLenum shaderType_local;
  string *filename_local;
  Shader *this_local;
  
  local_1c = shaderType;
  psStack_18 = filename;
  filename_local = (string *)this;
  pSVar3 = data(this);
  if (pSVar3->m_shaderProg == 0) {
    GVar2 = (*glad_glCreateProgram)();
    pSVar3 = data(this);
    pSVar3->m_shaderProg = GVar2;
  }
  LoadStringFromFile((lumeview *)&shaderSrcCStr,filename);
  pGStack_48 = (GLchar *)std::__cxx11::string::c_str();
  local_4c = (*glad_glCreateShader)(local_1c);
  (*glad_glShaderSource)(local_4c,1,&stack0xffffffffffffffb8,(GLint *)0x0);
  (*glad_glCompileShader)(local_4c);
  (*glad_glGetShaderiv)(local_4c,0x8b81,local_60);
  p_Var1 = glad_glAttachShader;
  if (local_60[0] == 0) {
    (*glad_glGetShaderInfoLog)(local_4c,0x200,(GLsizei *)0x0,local_268);
    std::__cxx11::stringstream::stringstream(local_3f0);
    poVar4 = std::operator<<(local_3e0,"SHADER::COMPILATION_FAILED in \'");
    poVar4 = std::operator<<(poVar4,(string *)filename);
    poVar4 = std::operator<<(poVar4,"\'\n");
    std::operator<<(poVar4,local_268);
    this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringstream::str();
    LumeviewError::LumeviewError(this_00,local_410);
    __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
  }
  pSVar3 = data(this);
  (*p_Var1)(pSVar3->m_shaderProg,local_4c);
  pSVar3 = data(this);
  pSVar3->m_linked = false;
  pSVar3 = data(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pSVar3->m_shaders,&local_4c);
  pSVar3 = data(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pSVar3->m_shaderNames,filename);
  pSVar3 = data(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&pSVar3->m_shaderTypes,&local_1c);
  std::__cxx11::string::~string((string *)&shaderSrcCStr);
  return;
}

Assistant:

void add_source (std::string filename, GLenum shaderType) {
		if (!data().m_shaderProg)
			data().m_shaderProg = glCreateProgram ();

	//	load the sources from a file
		std::string shaderSrc = LoadStringFromFile (filename);
		const char* shaderSrcCStr = shaderSrc.c_str();

	//	create the shader object and compile the sources
		uint shader;
		shader = glCreateShader (shaderType);
		glShaderSource (shader, 1, &shaderSrcCStr, NULL);
		glCompileShader (shader);

	//	check for errors
		int success;
		glGetShaderiv (shader, GL_COMPILE_STATUS, &success);
		if (!success) {
			char infoLog[512];
			glGetShaderInfoLog (shader, 512, NULL, infoLog);
			THROW("SHADER::COMPILATION_FAILED in '" << filename << "'\n" << infoLog);
		}

		glAttachShader (data().m_shaderProg, shader);
		data().m_linked = false;
		data().m_shaders.push_back (shader);
		data().m_shaderNames.push_back (filename);
		data().m_shaderTypes.push_back (shaderType);
	}